

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall Logger::flush(Logger *this)

{
  FILE *__stream;
  long *local_48 [2];
  long local_38 [2];
  
  __stream = _stderr;
  if (((int)enabled_level <= (int)this->m_level) && (this->m_empty == false)) {
    std::__cxx11::stringbuf::str();
    fputs((char *)local_48[0],__stream);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    fflush(_stderr);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
    std::__cxx11::stringbuf::str((string *)&this->field_0x18);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->os + -0x18) + (int)&this->os);
    std::ostream::seekp(&this->os,0,0);
    this->m_empty = true;
  }
  return;
}

Assistant:

void Logger::flush() {
    if ((m_level >= enabled_level) && !m_empty) {
        fprintf(stderr, "%s", os.str().c_str());
        fflush(stderr);
        os.str("");
        os.clear();
        os.seekp(0);
        m_empty = true;
    }
}